

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::Node::IsBoundedWord(Node *this,Compiler *compiler)

{
  long lVar1;
  CharSet<char16_t> *other;
  MatchSetNode *wordSet;
  WordBoundaryNode *leave;
  LoopNode *loop;
  WordBoundaryNode *enter;
  ConcatNode *concatNode;
  Compiler *compiler_local;
  Node *this_local;
  
  if (this->tag == Concat) {
    if ((((*(short *)(this[1]._vptr_Node + 1) == 3) &&
         (lVar1._0_2_ = this[1].tag, lVar1._2_2_ = this[1].features,
         lVar1._4_4_ = *(undefined4 *)&this[1].field_0xc, lVar1 != 0)) &&
        (*(short *)(*(long *)(*(long *)&this[1].tag + 0x38) + 8) == 10)) &&
       (((*(long *)(*(long *)&this[1].tag + 0x40) != 0 &&
         (*(short *)(*(long *)(*(long *)(*(long *)&this[1].tag + 0x40) + 0x38) + 8) == 3)) &&
        (*(long *)(*(long *)(*(long *)&this[1].tag + 0x40) + 0x40) == 0)))) {
      lVar1 = *(long *)(*(long *)&this[1].tag + 0x38);
      if (((((ulong)this[1]._vptr_Node[7] & 1) == 0) && ((*(byte *)(lVar1 + 0x4a) & 1) != 0)) &&
         ((*(int *)(lVar1 + 0x40) == 1 &&
          (((*(int *)(lVar1 + 0x44) == -1 && (*(short *)(*(long *)(lVar1 + 0x38) + 8) == 0xb)) &&
           ((*(byte *)(*(long *)(*(long *)(*(long *)&this[1].tag + 0x40) + 0x38) + 0x38) & 1) == 0))
          )))) {
        lVar1 = *(long *)(lVar1 + 0x38);
        if ((*(byte *)(lVar1 + 0x38) & 1) == 0) {
          other = StandardChars<char16_t>::GetWordSet(compiler->standardChars);
          this_local._7_1_ = CharSet<char16_t>::IsEqualTo((CharSet<char16_t> *)(lVar1 + 0x40),other)
          ;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Node::IsBoundedWord(Compiler& compiler) const
    {
        if (tag != Node::Concat)
            return false;

        const ConcatNode* concatNode = (const ConcatNode *)this;
        if (concatNode->head->tag != Node::WordBoundary ||
            concatNode->tail == 0 ||
            concatNode->tail->head->tag != Node::Loop ||
            concatNode->tail->tail == 0 ||
            concatNode->tail->tail->head->tag != Node::WordBoundary ||
            concatNode->tail->tail->tail != 0)
            return false;

        const WordBoundaryNode* enter = (const WordBoundaryNode*)concatNode->head;
        const LoopNode* loop = (const LoopNode*)concatNode->tail->head;
        const WordBoundaryNode* leave = (const WordBoundaryNode*)concatNode->tail->tail->head;

        if (enter->isNegation ||
            !loop->isGreedy ||
            loop->repeats.lower != 1 ||
            loop->repeats.upper != CharCountFlag ||
            loop->body->tag != Node::MatchSet ||
            leave->isNegation)
            return false;

        const MatchSetNode* wordSet = (const MatchSetNode*)loop->body;

        if (wordSet->isNegation)
            return false;

        return wordSet->set.IsEqualTo(*compiler.standardChars->GetWordSet());
    }